

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::bindTexture(ReferenceContext *this,deUint32 target,deUint32 texture)

{
  int unitNdx_00;
  bool bVar1;
  deBool dVar2;
  Type TVar3;
  Type local_2c;
  TextureCube *pTStack_28;
  Type expectedType;
  Texture *texObj;
  int unitNdx;
  deUint32 texture_local;
  deUint32 target_local;
  ReferenceContext *this_local;
  
  unitNdx_00 = this->m_activeTexture;
  while (((((target == 0xde0 || (target == 0xde1)) || (target == 0x8513)) ||
          ((target == 0x8c1a || (target == 0x806f)))) || (target == 0x9009))) {
    dVar2 = ::deGetFalse();
    if (dVar2 == 0) {
      while ((bVar1 = glu::isContextTypeES
                                ((ContextType)(this->m_limits).contextType.super_ApiType.m_bits),
             !bVar1 || (target != 0xde0))) {
        dVar2 = ::deGetFalse();
        if (dVar2 == 0) {
          if (texture == 0) {
            if (target == 0xde0) {
              setTex1DBinding(this,unitNdx_00,(Texture1D *)0x0);
            }
            else if (target == 0xde1) {
              setTex2DBinding(this,unitNdx_00,(Texture2D *)0x0);
            }
            else if (target == 0x806f) {
              setTex3DBinding(this,unitNdx_00,(Texture3D *)0x0);
            }
            else if (target == 0x8513) {
              setTexCubeBinding(this,unitNdx_00,(TextureCube *)0x0);
            }
            else if (target == 0x8c1a) {
              setTex2DArrayBinding(this,unitNdx_00,(Texture2DArray *)0x0);
            }
            else if (target == 0x9009) {
              setTexCubeArrayBinding(this,unitNdx_00,(TextureCubeArray *)0x0);
            }
          }
          else {
            pTStack_28 = (TextureCube *)
                         rc::ObjectManager<sglr::rc::Texture>::find(&this->m_textures,texture);
            if (pTStack_28 == (TextureCube *)0x0) {
              if (target == 0xde0) {
                pTStack_28 = (TextureCube *)operator_new(0x5b0);
                rc::Texture1D::Texture1D((Texture1D *)pTStack_28,texture);
              }
              else if (target == 0xde1) {
                pTStack_28 = (TextureCube *)operator_new(0x5b0);
                rc::Texture2D::Texture2D((Texture2D *)pTStack_28,texture);
              }
              else if (target == 0x806f) {
                pTStack_28 = (TextureCube *)operator_new(0x5b0);
                rc::Texture3D::Texture3D((Texture3D *)pTStack_28,texture);
              }
              else if (target == 0x8513) {
                pTStack_28 = (TextureCube *)operator_new(0x2018);
                rc::TextureCube::TextureCube(pTStack_28,texture);
              }
              else if (target == 0x8c1a) {
                pTStack_28 = (TextureCube *)operator_new(0x5b0);
                rc::Texture2DArray::Texture2DArray((Texture2DArray *)pTStack_28,texture);
              }
              else if (target == 0x9009) {
                pTStack_28 = (TextureCube *)operator_new(0x5b0);
                rc::TextureCubeArray::TextureCubeArray((TextureCubeArray *)pTStack_28,texture);
              }
              rc::ObjectManager<sglr::rc::Texture>::insert
                        (&this->m_textures,&pTStack_28->super_Texture);
            }
            else {
              local_2c = TYPE_LAST;
              if (target == 0xde0) {
                local_2c = TYPE_1D;
              }
              else if (target == 0xde1) {
                local_2c = TYPE_2D;
              }
              else if (target == 0x806f) {
                local_2c = TYPE_3D;
              }
              else if (target == 0x8513) {
                local_2c = TYPE_CUBE_MAP;
              }
              else if (target == 0x8c1a) {
                local_2c = TYPE_2D_ARRAY;
              }
              else if (target == 0x9009) {
                local_2c = TYPE_CUBE_MAP_ARRAY;
              }
              do {
                TVar3 = rc::Texture::getType((Texture *)pTStack_28);
                if (TVar3 != local_2c) {
                  setError(this,0x502);
                  return;
                }
                dVar2 = ::deGetFalse();
              } while (dVar2 != 0);
            }
            if (target == 0xde0) {
              setTex1DBinding(this,unitNdx_00,(Texture1D *)pTStack_28);
            }
            else if (target == 0xde1) {
              setTex2DBinding(this,unitNdx_00,(Texture2D *)pTStack_28);
            }
            else if (target == 0x806f) {
              setTex3DBinding(this,unitNdx_00,(Texture3D *)pTStack_28);
            }
            else if (target == 0x8513) {
              setTexCubeBinding(this,unitNdx_00,pTStack_28);
            }
            else if (target == 0x8c1a) {
              setTex2DArrayBinding(this,unitNdx_00,(Texture2DArray *)pTStack_28);
            }
            else if (target == 0x9009) {
              setTexCubeArrayBinding(this,unitNdx_00,(TextureCubeArray *)pTStack_28);
            }
          }
          return;
        }
      }
      setError(this,0x500);
      return;
    }
  }
  setError(this,0x500);
  return;
}

Assistant:

void ReferenceContext::bindTexture (deUint32 target, deUint32 texture)
{
	int unitNdx = m_activeTexture;

	RC_IF_ERROR(target != GL_TEXTURE_1D				&&
				target != GL_TEXTURE_2D				&&
				target != GL_TEXTURE_CUBE_MAP		&&
				target != GL_TEXTURE_2D_ARRAY		&&
				target != GL_TEXTURE_3D				&&
				target != GL_TEXTURE_CUBE_MAP_ARRAY,
				GL_INVALID_ENUM, RC_RET_VOID);

	RC_IF_ERROR(glu::isContextTypeES(m_limits.contextType) && (target == GL_TEXTURE_1D), GL_INVALID_ENUM, RC_RET_VOID);

	if (texture == 0)
	{
		// Clear binding.
		switch (target)
		{
			case GL_TEXTURE_1D:				setTex1DBinding			(unitNdx, DE_NULL);	break;
			case GL_TEXTURE_2D:				setTex2DBinding			(unitNdx, DE_NULL);	break;
			case GL_TEXTURE_CUBE_MAP:		setTexCubeBinding		(unitNdx, DE_NULL);	break;
			case GL_TEXTURE_2D_ARRAY:		setTex2DArrayBinding	(unitNdx, DE_NULL);	break;
			case GL_TEXTURE_3D:				setTex3DBinding			(unitNdx, DE_NULL);	break;
			case GL_TEXTURE_CUBE_MAP_ARRAY:	setTexCubeArrayBinding	(unitNdx, DE_NULL);	break;
			default:
				DE_ASSERT(false);
		}
	}
	else
	{
		Texture* texObj = m_textures.find(texture);

		if (texObj)
		{
			// Validate type.
			Texture::Type expectedType = Texture::TYPE_LAST;
			switch (target)
			{
				case GL_TEXTURE_1D:				expectedType = Texture::TYPE_1D;				break;
				case GL_TEXTURE_2D:				expectedType = Texture::TYPE_2D;				break;
				case GL_TEXTURE_CUBE_MAP:		expectedType = Texture::TYPE_CUBE_MAP;			break;
				case GL_TEXTURE_2D_ARRAY:		expectedType = Texture::TYPE_2D_ARRAY;			break;
				case GL_TEXTURE_3D:				expectedType = Texture::TYPE_3D;				break;
				case GL_TEXTURE_CUBE_MAP_ARRAY:	expectedType = Texture::TYPE_CUBE_MAP_ARRAY;	break;
				default:
					DE_ASSERT(false);
			}
			RC_IF_ERROR(texObj->getType() != expectedType, GL_INVALID_OPERATION, RC_RET_VOID);
		}
		else
		{
			// New texture object.
			switch (target)
			{
				case GL_TEXTURE_1D:				texObj = new Texture1D			(texture);	break;
				case GL_TEXTURE_2D:				texObj = new Texture2D			(texture);	break;
				case GL_TEXTURE_CUBE_MAP:		texObj = new TextureCube		(texture);	break;
				case GL_TEXTURE_2D_ARRAY:		texObj = new Texture2DArray		(texture);	break;
				case GL_TEXTURE_3D:				texObj = new Texture3D			(texture);	break;
				case GL_TEXTURE_CUBE_MAP_ARRAY:	texObj = new TextureCubeArray	(texture);	break;
				default:
					DE_ASSERT(false);
			}

			m_textures.insert(texObj);
		}

		switch (target)
		{
			case GL_TEXTURE_1D:				setTex1DBinding			(unitNdx, static_cast<Texture1D*>			(texObj));	break;
			case GL_TEXTURE_2D:				setTex2DBinding			(unitNdx, static_cast<Texture2D*>			(texObj));	break;
			case GL_TEXTURE_CUBE_MAP:		setTexCubeBinding		(unitNdx, static_cast<TextureCube*>			(texObj));	break;
			case GL_TEXTURE_2D_ARRAY:		setTex2DArrayBinding	(unitNdx, static_cast<Texture2DArray*>		(texObj));	break;
			case GL_TEXTURE_3D:				setTex3DBinding			(unitNdx, static_cast<Texture3D*>			(texObj));	break;
			case GL_TEXTURE_CUBE_MAP_ARRAY:	setTexCubeArrayBinding	(unitNdx, static_cast<TextureCubeArray*>	(texObj));	break;
			default:
				DE_ASSERT(false);
		}
	}
}